

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XIncludeUtils.cpp
# Opt level: O3

XMLCh * xercesc_4_0::getBaseAttrValue(DOMNode *node)

{
  short sVar1;
  short sVar2;
  int iVar3;
  long *plVar4;
  long lVar5;
  long *plVar6;
  short *psVar7;
  XMLCh *pXVar8;
  short *psVar9;
  long lVar10;
  undefined4 extraout_var;
  
  iVar3 = (*node->_vptr_DOMNode[4])();
  if ((iVar3 == 1) && (iVar3 = (*node->_vptr_DOMNode[0x1a])(node), (char)iVar3 != '\0')) {
    iVar3 = (*node->_vptr_DOMNode[0xb])(node);
    plVar4 = (long *)CONCAT44(extraout_var,iVar3);
    lVar5 = (**(code **)(*plVar4 + 0x28))(plVar4);
    if (lVar5 != 0) {
      lVar10 = 0;
      do {
        plVar6 = (long *)(**(code **)(*plVar4 + 0x18))(plVar4,lVar10);
        psVar7 = (short *)(**(code **)(*plVar6 + 0x140))(plVar6);
        if (psVar7 == &XIncludeUtils::fgXIBaseAttrName) {
LAB_0033c7b0:
          pXVar8 = (XMLCh *)(**(code **)(*plVar6 + 0x150))(plVar6);
          return pXVar8;
        }
        psVar9 = &XIncludeUtils::fgXIBaseAttrName;
        if (psVar7 == (short *)0x0) {
LAB_0033c796:
          if (*psVar9 == 0) goto LAB_0033c7b0;
        }
        else {
          psVar9 = &XIncludeUtils::fgXIBaseAttrName;
          do {
            sVar1 = *psVar7;
            if (sVar1 == 0) goto LAB_0033c796;
            psVar7 = psVar7 + 1;
            sVar2 = *psVar9;
            psVar9 = psVar9 + 1;
          } while (sVar1 == sVar2);
        }
        lVar10 = lVar10 + 1;
      } while (lVar10 != lVar5);
    }
  }
  return (XMLCh *)0x0;
}

Assistant:

static const XMLCh *
getBaseAttrValue(DOMNode *node){
    if (node->getNodeType() == DOMNode::ELEMENT_NODE){
        DOMElement *elem = (DOMElement *)node;
        if(elem->hasAttributes()) {
            /* get all the attributes of the node */
            DOMNamedNodeMap *pAttributes = elem->getAttributes();
            XMLSize_t nSize = pAttributes->getLength();
            for(XMLSize_t i=0;i<nSize;++i) {
                DOMAttr *pAttributeNode = (DOMAttr*) pAttributes->item(i);
                /* get attribute name */
                if (XMLString::equals(pAttributeNode->getName(), XIncludeUtils::fgXIBaseAttrName)){
                    /*if (namespace == XMLUni::fgXMLString){

                    }*/
                    return pAttributeNode->getValue();
                }
            }
        }
    }
    return NULL;
}